

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

Ref __thiscall wasm::Wasm2JSBuilder::processWasm(Wasm2JSBuilder *this,Module *wasm,Name funcName)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  int iVar1;
  pointer puVar2;
  Export *pEVar3;
  unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_> uVar4;
  char *pcVar5;
  pointer puVar6;
  pointer puVar7;
  __uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_> _Var8;
  pointer puVar9;
  Table *imp;
  pointer puVar10;
  Global *pGVar11;
  bool bVar12;
  undefined1 uVar13;
  HeapType type;
  uintptr_t uVar14;
  undefined8 uVar15;
  size_t sVar16;
  size_t sVar17;
  bool bVar18;
  char cVar19;
  char *pcVar20;
  pointer puVar21;
  mapped_type *pmVar22;
  ostream *poVar23;
  undefined8 *puVar24;
  Ref RVar25;
  Ref RVar26;
  Ref RVar27;
  Value *pVVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  Function *pFVar31;
  size_t *psVar32;
  Value *this_02;
  Value *this_03;
  char *pcVar33;
  char *pcVar34;
  long lVar35;
  Wasm2JSBuilder *pWVar36;
  uint uVar37;
  ulong uVar38;
  char *extraout_RDX;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar39;
  pointer puVar40;
  pointer puVar41;
  variant<wasm::Name,_wasm::HeapType> *pvVar42;
  PassOptions *pPVar43;
  void *pvVar44;
  PassOptions *pPVar45;
  Ref in_R8;
  vector<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
  *__range1;
  iterator __end2_2;
  __hashtable *__h;
  ulong uVar46;
  pointer puVar47;
  byte bVar48;
  IString arg;
  IString name;
  IString name_00;
  IString op;
  IString name_01;
  IString name_02;
  IString op_00;
  undefined1 auVar49 [16];
  anon_union_16_6_a0c44491_for_Value_2 aVar50;
  IString name_03;
  Name name_04;
  PassOptions local_a50;
  undefined1 auStack_998 [8];
  PassRunner runner;
  undefined1 local_798 [280];
  size_type *local_680 [2];
  size_type local_670 [2];
  char local_660;
  __node_base *local_658 [2];
  __node_base local_648 [2];
  char local_638;
  __node_base_ptr *local_630 [2];
  __node_base_ptr local_620 [2];
  char local_610;
  __node_base local_608 [2];
  _Hash_node_base local_5f8 [2];
  char local_5e8;
  __node_base *local_5e0 [2];
  __node_base local_5d0 [2];
  char local_5c0;
  long *local_5b8 [2];
  long local_5a8 [2];
  char local_598;
  long *local_590 [2];
  long local_580 [2];
  char local_570;
  long *local_568 [2];
  long local_558 [2];
  char local_548;
  long *local_540 [2];
  long local_530 [2];
  char local_520;
  long *local_518 [2];
  long local_508 [2];
  char local_4f8;
  long *local_4f0 [2];
  long local_4e0 [2];
  char local_4d0;
  long *local_4c8 [2];
  long local_4b8 [2];
  char local_4a8;
  long *local_4a0 [2];
  long local_490 [2];
  char local_480;
  long *local_478 [2];
  long local_468 [2];
  char local_458;
  long *local_450 [2];
  long local_440 [2];
  char local_430;
  long *local_428 [2];
  long local_418 [2];
  char local_408;
  long *local_400 [2];
  long local_3f0 [2];
  char local_3e0;
  long *local_3d8 [2];
  long local_3c8 [2];
  char local_3b8;
  long *local_3b0 [2];
  long local_3a0 [2];
  char local_390;
  long *local_388 [2];
  long local_378 [2];
  char local_368;
  long *local_360 [2];
  long local_350 [2];
  char local_340;
  long *local_338 [2];
  long local_328 [2];
  long *local_318 [2];
  long local_308 [2];
  long *local_2f8 [2];
  long local_2e8 [2];
  long *local_2d8 [2];
  long local_2c8 [2];
  long *local_2b8 [2];
  long local_2a8 [2];
  long *local_298 [2];
  long local_288 [2];
  long *local_278 [2];
  long local_268 [2];
  long *local_258 [2];
  long local_248 [2];
  long *local_238 [2];
  long local_228 [2];
  long *local_218 [2];
  long local_208 [2];
  long *local_1f8 [2];
  long local_1e8 [2];
  long *local_1d8 [2];
  long local_1c8 [2];
  long *local_1b8 [2];
  long local_1a8 [2];
  long *local_198 [2];
  long local_188 [2];
  long *local_178 [2];
  long local_168 [2];
  long *local_158 [2];
  long local_148 [2];
  long *local_138 [2];
  long local_128 [2];
  long *local_118 [2];
  long local_108 [2];
  long *local_f8 [2];
  long local_e8 [2];
  long *local_d8 [2];
  long local_c8 [2];
  long *local_b8 [2];
  long local_a8 [2];
  Value *local_98;
  Ref ret;
  Function *local_70;
  Ref RStack_68;
  const_iterator __end2;
  iterator __end2_1;
  char local_38;
  undefined7 uStack_37;
  Ref asmFunc;
  
  pcVar33 = funcName.super_IString.str._M_str;
  bVar48 = 0;
  puVar39 = (wasm->exports).
            super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = (wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pcVar34 = pcVar33;
  if (puVar39 != puVar2) {
    do {
      pEVar3 = (puVar39->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      if (pEVar3->kind == Function) {
        if (*(__index_type *)
             ((long)&(pEVar3->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) == '\0'
           ) {
          pvVar42 = &pEVar3->value;
        }
        else {
          pvVar42 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
        }
        auStack_998 = (undefined1  [8])&this->functionsCallableFromOutside;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&this->functionsCallableFromOutside,pvVar42,auStack_998);
      }
      puVar39 = puVar39 + 1;
    } while (puVar39 != puVar2);
  }
  pVVar28 = (Value *)(wasm->elementSegments).
                     super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
  RStack_68.inst =
       (Value *)(wasm->elementSegments).
                super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
  if (pVVar28 != RStack_68.inst) {
    do {
      uVar4._M_t.
      super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>._M_t.
      super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>.
      super__Head_base<0UL,_wasm::ElementSegment_*,_false>._M_head_impl =
           *(__uniq_ptr_data<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>,_true,_true>
             *)pVVar28;
      bVar18 = Type::isFunction((Type *)((long)uVar4._M_t.
                                               super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                               ._M_t.
                                               super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                               .super__Head_base<0UL,_wasm::ElementSegment_*,_false>
                                               ._M_head_impl + 0x30));
      if (bVar18) {
        pcVar20 = *(char **)((long)uVar4._M_t.
                                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                   _M_head_impl + 0x38);
        pcVar34 = *(char **)((long)uVar4._M_t.
                                   super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                   .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                   _M_head_impl + 0x40);
        if (pcVar34 != pcVar20) {
          uVar38 = 0;
          uVar46 = 1;
          do {
            pcVar5 = *(char **)(pcVar20 + uVar38 * 8);
            if (*pcVar5 == '+') {
              auStack_998 = *(undefined1 (*) [8])(pcVar5 + 0x10);
              _runner = *(undefined8 *)(pcVar5 + 0x18);
              _local_38 = (__hashtable_alloc *)&this->functionsCallableFromOutside;
              std::
              _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::
              _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                        ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)&this->functionsCallableFromOutside,auStack_998,&stack0xffffffffffffffc8
                        );
              pcVar20 = *(char **)((long)uVar4._M_t.
                                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                         _M_head_impl + 0x38);
              pcVar34 = *(char **)((long)uVar4._M_t.
                                         super___uniq_ptr_impl<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_wasm::ElementSegment_*,_std::default_delete<wasm::ElementSegment>_>
                                         .super__Head_base<0UL,_wasm::ElementSegment_*,_false>.
                                         _M_head_impl + 0x40);
            }
            bVar18 = uVar46 < (ulong)((long)pcVar34 - (long)pcVar20 >> 3);
            uVar38 = uVar46;
            uVar46 = (ulong)((int)uVar46 + 1);
          } while (bVar18);
        }
      }
      pVVar28 = (Value *)&pVVar28->field_1;
    } while (pVVar28 != RStack_68.inst);
  }
  puVar21 = (wasm->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((wasm->dataSegments).
      super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar21) {
    pcVar20 = (char *)0x0;
    do {
      pmVar22 = std::__detail::
                _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this,(key_type *)
                                     puVar21[(long)pcVar20]._M_t.
                                     super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_wasm::DataSegment_*,_std::default_delete<wasm::DataSegment>_>
                                     .super__Head_base<0UL,_wasm::DataSegment_*,_false>._M_head_impl
                            );
      *pmVar22 = (mapped_type)pcVar20;
      pcVar20 = (char *)(ulong)((mapped_type)pcVar20 + 1);
      puVar21 = (wasm->dataSegments).
                super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pcVar34 = (char *)((long)(wasm->dataSegments).
                               super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish - (long)puVar21 >> 3);
    } while (pcVar20 < pcVar34);
  }
  auVar49._8_8_ = 0;
  auVar49._0_8_ = pcVar34;
  ABI::wasm2js::ensureHelpers((wasm2js *)wasm,(Module *)0x0,(IString)(auVar49 << 0x40));
  pPVar43 = &this->options;
  pPVar45 = &local_a50;
  for (lVar35 = 8; lVar35 != 0; lVar35 = lVar35 + -1) {
    bVar18 = pPVar43->validate;
    bVar12 = pPVar43->validateGlobally;
    uVar13 = pPVar43->field_0x3;
    iVar1 = pPVar43->optimizeLevel;
    pPVar45->debug = pPVar43->debug;
    pPVar45->validate = bVar18;
    pPVar45->validateGlobally = bVar12;
    pPVar45->field_0x3 = uVar13;
    pPVar45->optimizeLevel = iVar1;
    pPVar43 = (PassOptions *)((long)pPVar43 + (ulong)bVar48 * -0x10 + 8);
    pPVar45 = (PassOptions *)((long)pPVar45 + ((ulong)bVar48 * -2 + 1) * 8);
  }
  local_a50.targetJS = (this->options).targetJS;
  this_00 = &local_a50.arguments;
  local_a50.arguments._M_h._M_buckets = (__buckets_ptr)0x0;
  local_a50.arguments._M_h._M_bucket_count = (this->options).arguments._M_h._M_bucket_count;
  local_a50.arguments._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a50.arguments._M_h._M_element_count = (this->options).arguments._M_h._M_element_count;
  local_a50.arguments._M_h._M_rehash_policy._M_max_load_factor =
       (this->options).arguments._M_h._M_rehash_policy._M_max_load_factor;
  local_a50.arguments._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)&(this->options).arguments._M_h._M_rehash_policy.field_0x4;
  local_a50.arguments._M_h._M_rehash_policy._M_next_resize =
       (this->options).arguments._M_h._M_rehash_policy._M_next_resize;
  local_a50.arguments._M_h._M_single_bucket = (__node_base_ptr)0x0;
  _local_38 = (__hashtable_alloc *)this_00;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,std::__cxx11::string>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)this_00,&(this->options).arguments._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>_>_>
              *)&stack0xffffffffffffffc8);
  this_01 = &local_a50.passesToSkip;
  local_a50.passesToSkip._M_h._M_buckets = (__buckets_ptr)0x0;
  local_a50.passesToSkip._M_h._M_bucket_count = (this->options).passesToSkip._M_h._M_bucket_count;
  local_a50.passesToSkip._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_a50.passesToSkip._M_h._M_element_count = (this->options).passesToSkip._M_h._M_element_count;
  local_a50.passesToSkip._M_h._M_rehash_policy._M_max_load_factor =
       (this->options).passesToSkip._M_h._M_rehash_policy._M_max_load_factor;
  local_a50.passesToSkip._M_h._M_rehash_policy._4_4_ =
       *(undefined4 *)&(this->options).passesToSkip._M_h._M_rehash_policy.field_0x4;
  local_a50.passesToSkip._M_h._M_rehash_policy._M_next_resize =
       (this->options).passesToSkip._M_h._M_rehash_policy._M_next_resize;
  local_a50.passesToSkip._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pWVar36 = this;
  _local_38 = (__hashtable_alloc *)this_01;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)this_01,&(this->options).passesToSkip._M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&stack0xffffffffffffffc8);
  PassRunner::PassRunner((PassRunner *)auStack_998,wasm,&local_a50);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&this_01->_M_h);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&this_00->_M_h);
  if ((this->flags).emscripten == true) {
    local_338[0] = local_328;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_338,"llvm-nontrapping-fptoint-lowering","");
    local_660 = '\0';
    ::wasm::PassRunner::add(auStack_998,local_338,local_680);
    if ((local_660 == '\x01') && (local_660 = '\0', local_680[0] != local_670)) {
      operator_delete(local_680[0],local_670[0] + 1);
    }
    if (local_338[0] != local_328) {
      operator_delete(local_338[0],local_328[0] + 1);
    }
  }
  local_318[0] = local_308;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_318,"legalize-js-interface","");
  local_638 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_318,local_658);
  if ((local_638 == '\x01') && (local_638 = '\0', local_658[0] != local_648)) {
    operator_delete(local_658[0],(ulong)((long)&(local_648[0]._M_nxt)->_M_nxt + 1));
  }
  if (local_318[0] != local_308) {
    operator_delete(local_318[0],local_308[0] + 1);
  }
  if (0 < (this->options).optimizeLevel) {
    local_2f8[0] = local_2e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f8,"optimize-for-js","");
    local_610 = '\0';
    ::wasm::PassRunner::add(auStack_998,local_2f8,local_630);
    if ((local_610 == '\x01') && (local_610 = '\0', local_630[0] != local_620)) {
      operator_delete(local_630[0],(ulong)((long)&local_620[0]->_M_nxt + 1));
    }
    if (local_2f8[0] != local_2e8) {
      operator_delete(local_2f8[0],local_2e8[0] + 1);
    }
  }
  local_2d8[0] = local_2c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"remove-non-js-ops","");
  local_5e8 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_2d8,local_608);
  if ((local_5e8 == '\x01') && (local_5e8 = '\0', local_608[0]._M_nxt != local_5f8)) {
    operator_delete(local_608[0]._M_nxt,(ulong)((long)&(local_5f8[0]._M_nxt)->_M_nxt + 1));
  }
  if (local_2d8[0] != local_2c8) {
    operator_delete(local_2d8[0],local_2c8[0] + 1);
  }
  local_2b8[0] = local_2a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"flatten","");
  local_5c0 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_2b8,local_5e0);
  if ((local_5c0 == '\x01') && (local_5c0 = '\0', local_5e0[0] != local_5d0)) {
    operator_delete(local_5e0[0],(ulong)((long)&(local_5d0[0]._M_nxt)->_M_nxt + 1));
  }
  if (local_2b8[0] != local_2a8) {
    operator_delete(local_2b8[0],local_2a8[0] + 1);
  }
  local_298[0] = local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_298,"i64-to-i32-lowering","");
  local_598 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_298,local_5b8);
  if ((local_598 == '\x01') && (local_598 = '\0', local_5b8[0] != local_5a8)) {
    operator_delete(local_5b8[0],local_5a8[0] + 1);
  }
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],local_288[0] + 1);
  }
  local_278[0] = local_268;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_278,"alignment-lowering","");
  local_570 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_278,local_590);
  if ((local_570 == '\x01') && (local_570 = '\0', local_590[0] != local_580)) {
    operator_delete(local_590[0],local_580[0] + 1);
  }
  if (local_278[0] != local_268) {
    operator_delete(local_278[0],local_268[0] + 1);
  }
  uVar37 = (this->options).optimizeLevel;
  if (0 < (int)uVar37) {
    if ((2 < uVar37) || (0 < (this->options).shrinkLevel)) {
      local_258[0] = local_248;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_258,"simplify-locals-nonesting","");
      local_548 = '\0';
      ::wasm::PassRunner::add(auStack_998,local_258,local_568);
      if ((local_548 == '\x01') && (local_548 = '\0', local_568[0] != local_558)) {
        operator_delete(local_568[0],local_558[0] + 1);
      }
      if (local_258[0] != local_248) {
        operator_delete(local_258[0],local_248[0] + 1);
      }
      local_238[0] = local_228;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"precompute-propagate","")
      ;
      local_520 = '\0';
      ::wasm::PassRunner::add(auStack_998,local_238,local_540);
      if ((local_520 == '\x01') && (local_520 = '\0', local_540[0] != local_530)) {
        operator_delete(local_540[0],local_530[0] + 1);
      }
      if (local_238[0] != local_228) {
        operator_delete(local_238[0],local_228[0] + 1);
      }
      local_218[0] = local_208;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_218,"avoid-reinterprets","");
      local_4f8 = '\0';
      ::wasm::PassRunner::add(auStack_998,local_218,local_518);
      if ((local_4f8 == '\x01') && (local_4f8 = '\0', local_518[0] != local_508)) {
        operator_delete(local_518[0],local_508[0] + 1);
      }
      if (local_218[0] != local_208) {
        operator_delete(local_218[0],local_208[0] + 1);
      }
    }
    ::wasm::PassRunner::addDefaultOptimizationPasses();
    local_1f8[0] = local_1e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1f8,"avoid-reinterprets","");
    local_4d0 = '\0';
    ::wasm::PassRunner::add(auStack_998,local_1f8,local_4f0);
    if ((local_4d0 == '\x01') && (local_4d0 = '\0', local_4f0[0] != local_4e0)) {
      operator_delete(local_4f0[0],local_4e0[0] + 1);
    }
    if (local_1f8[0] != local_1e8) {
      operator_delete(local_1f8[0],local_1e8[0] + 1);
    }
  }
  local_1d8[0] = local_1c8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1d8,"flatten","");
  local_4a8 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_1d8,local_4c8);
  if ((local_4a8 == '\x01') && (local_4a8 = '\0', local_4c8[0] != local_4b8)) {
    operator_delete(local_4c8[0],local_4b8[0] + 1);
  }
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0],local_1c8[0] + 1);
  }
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"simplify-locals-notee-nostructure","");
  local_480 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_1b8,local_4a0);
  if ((local_480 == '\x01') && (local_480 = '\0', local_4a0[0] != local_490)) {
    operator_delete(local_4a0[0],local_490[0] + 1);
  }
  if (local_1b8[0] != local_1a8) {
    operator_delete(local_1b8[0],local_1a8[0] + 1);
  }
  if (0 < (this->options).optimizeLevel) {
    local_198[0] = local_188;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"remove-unused-names","");
    local_458 = '\0';
    ::wasm::PassRunner::add(auStack_998,local_198,local_478);
    if ((local_458 == '\x01') && (local_458 = '\0', local_478[0] != local_468)) {
      operator_delete(local_478[0],local_468[0] + 1);
    }
    if (local_198[0] != local_188) {
      operator_delete(local_198[0],local_188[0] + 1);
    }
    local_178[0] = local_168;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_178,"merge-blocks","");
    local_430 = '\0';
    ::wasm::PassRunner::add(auStack_998,local_178,local_450);
    if ((local_430 == '\x01') && (local_430 = '\0', local_450[0] != local_440)) {
      operator_delete(local_450[0],local_440[0] + 1);
    }
    if (local_178[0] != local_168) {
      operator_delete(local_178[0],local_168[0] + 1);
    }
    local_158[0] = local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_158,"reorder-locals","");
    local_408 = '\0';
    ::wasm::PassRunner::add(auStack_998,local_158,local_428);
    if ((local_408 == '\x01') && (local_408 = '\0', local_428[0] != local_418)) {
      operator_delete(local_428[0],local_418[0] + 1);
    }
    if (local_158[0] != local_148) {
      operator_delete(local_158[0],local_148[0] + 1);
    }
    local_138[0] = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"coalesce-locals","");
    local_3e0 = '\0';
    ::wasm::PassRunner::add(auStack_998,local_138,local_400);
    if ((local_3e0 == '\x01') && (local_3e0 = '\0', local_400[0] != local_3f0)) {
      operator_delete(local_400[0],local_3f0[0] + 1);
    }
    if (local_138[0] != local_128) {
      operator_delete(local_138[0],local_128[0] + 1);
    }
  }
  local_118[0] = local_108;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"reorder-locals","");
  local_3b8 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_118,local_3d8);
  if ((local_3b8 == '\x01') && (local_3b8 = '\0', local_3d8[0] != local_3c8)) {
    operator_delete(local_3d8[0],local_3c8[0] + 1);
  }
  if (local_118[0] != local_108) {
    operator_delete(local_118[0],local_108[0] + 1);
  }
  local_f8[0] = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"vacuum","");
  local_390 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_f8,local_3b0);
  if ((local_390 == '\x01') && (local_390 = '\0', local_3b0[0] != local_3a0)) {
    operator_delete(local_3b0[0],local_3a0[0] + 1);
  }
  if (local_f8[0] != local_e8) {
    operator_delete(local_f8[0],local_e8[0] + 1);
  }
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d8,"remove-unused-module-elements","");
  local_368 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_d8,local_388);
  if ((local_368 == '\x01') && (local_368 = '\0', local_388[0] != local_378)) {
    operator_delete(local_388[0],local_378[0] + 1);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0],local_c8[0] + 1);
  }
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"dce","");
  local_340 = '\0';
  ::wasm::PassRunner::add(auStack_998,local_b8,local_360);
  if ((local_340 == '\x01') && (local_340 = '\0', local_360[0] != local_350)) {
    operator_delete(local_360[0],local_350[0] + 1);
  }
  if (local_b8[0] != local_a8) {
    operator_delete(local_b8[0],local_a8[0] + 1);
  }
  ::wasm::PassRunner::run();
  PassRunner::~PassRunner((PassRunner *)auStack_998);
  if ((this->flags).symbolsFile._M_string_length != 0) {
    ::wasm::Output::Output((Output *)auStack_998,(string *)&(this->flags).symbolsFile,Text);
    puVar40 = (wasm->functions).
              super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar6 = (wasm->functions).
             super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar40 != puVar6) {
      do {
        poVar23 = std::ostream::_M_insert<unsigned_long>((ulong)local_798);
        local_38 = ':';
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar23,&stack0xffffffffffffffc8,1);
        pWVar36 = (Wasm2JSBuilder *)
                  (puVar40->_M_t).
                  super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                  super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                  super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
        poVar23 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar23,*(char **)((long)&((Importable *)&pWVar36->dataIndices)->
                                                       super_Named + 8),
                             *(long *)&((Importable *)&pWVar36->dataIndices)->super_Named);
        local_38 = 10;
        std::__ostream_insert<char,std::char_traits<char>>(poVar23,&stack0xffffffffffffffc8,1);
        puVar40 = puVar40 + 1;
      } while (puVar40 != puVar6);
    }
    Output::~Output((Output *)auStack_998);
  }
  cVar19 = ::wasm::WasmValidator::validate((Module *)auStack_998,(uint)wasm);
  if (cVar19 == '\0') {
    poVar23 = (ostream *)std::operator<<((ostream *)&std::cout,wasm);
    auStack_998[0] = 10;
    std::__ostream_insert<char,std::char_traits<char>>(poVar23,auStack_998,1);
    Fatal::Fatal((Fatal *)auStack_998);
    Fatal::operator<<((Fatal *)auStack_998,(char (*) [35])"error in validating wasm2js output");
    Fatal::~Fatal((Fatal *)auStack_998);
  }
  local_98 = (Value *)cashew::ValueBuilder::makeToplevel();
  name_03.str._M_str = extraout_RDX;
  name_03.str._M_len = (size_t)pcVar33;
  _local_38 = (__hashtable_alloc *)
              cashew::ValueBuilder::makeFunction(funcName.super_IString.str._M_len,name_03);
  puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&local_98);
  cashew::Value::push_back((Value *)*puVar24,(Ref)_local_38);
  arg.str._M_str = (char *)pWVar36;
  arg.str._M_len = (size_t)_ZN4wasmL12importObjectE_1;
  cashew::ValueBuilder::appendArgumentToFunction
            ((ValueBuilder *)_local_38,_ZN4wasmL12importObjectE_0,arg);
  puVar7 = (wasm->memories).
           super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != (wasm->memories).
                super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    if (*(char **)((long)&(((puVar7->_M_t).
                            super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                            .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl)->
                          super_Importable).module + 8) == (char *)0x0) {
      RVar25 = cashew::ValueBuilder::makeVar(false);
      puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      cashew::Value::push_back((Value *)*puVar24,RVar25);
      sVar16 = cashew::LOAD;
      RStack_68.inst = BUFFER;
      aVar50 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(0xb,"ArrayBuffer",0);
      pvVar44 = (void *)0x18;
      RVar26.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar26.inst)->type = Null;
      cashew::Value::free(RVar26.inst,pvVar44);
      (RVar26.inst)->type = String;
      (RVar26.inst)->field_1 = aVar50;
      iVar1 = *(int *)((long)(((wasm->memories).
                               super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                             super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                             ._M_t + 0x38);
      pvVar44 = (void *)0x18;
      RVar27.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar27.inst)->type = Null;
      cashew::Value::free(RVar27.inst,pvVar44);
      (RVar27.inst)->type = Number;
      ((RVar27.inst)->field_1).num = (double)(uint)(iVar1 << 0x10);
      RVar26 = cashew::ValueBuilder::makeCall(RVar26,RVar27);
      RVar26 = cashew::ValueBuilder::makeNew(RVar26);
      name_01.str._M_str = (char *)RVar26.inst;
      name_01.str._M_len = sVar16;
      cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar25.inst,RStack_68,name_01,in_R8);
    }
    else {
      puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      ensureModuleVar(this,(Value *)*puVar24,
                      (Importable *)
                      (((wasm->memories).
                        super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                      super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t);
      RVar25 = cashew::ValueBuilder::makeVar(false);
      puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      cashew::Value::push_back((Value *)*puVar24,RVar25);
      auVar49 = ::wasm::IString::interned(6,"memory",0);
      name.str._M_len = auVar49._8_8_;
      RVar26 = getImportName(this,(Importable *)
                                  (((wasm->memories).
                                    super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                                  super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>
                                  ._M_t);
      name.str._M_str = (char *)RVar26.inst;
      cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar25.inst,auVar49._0_8_,name,in_R8);
      RVar25 = cashew::ValueBuilder::makeVar(false);
      puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      cashew::Value::push_back((Value *)*puVar24,RVar25);
      sVar16 = cashew::LOAD;
      RStack_68.inst = BUFFER;
      aVar50 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(6,"memory",0);
      pvVar44 = (void *)0x18;
      RVar26.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar26.inst)->type = Null;
      cashew::Value::free(RVar26.inst,pvVar44);
      (RVar26.inst)->type = String;
      (RVar26.inst)->field_1 = aVar50;
      aVar50 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(6,"buffer",0);
      pvVar44 = (void *)0x18;
      RVar27.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar27.inst)->type = Null;
      cashew::Value::free(RVar27.inst,pvVar44);
      (RVar27.inst)->type = String;
      (RVar27.inst)->field_1 = aVar50;
      RVar26 = cashew::ValueBuilder::makeDot(RVar26,RVar27);
      name_00.str._M_str = (char *)RVar26.inst;
      name_00.str._M_len = sVar16;
      cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar25.inst,RStack_68,name_00,in_R8);
      _Var8._M_t.super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>.
      super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl =
           (((wasm->memories).
             super__Vector_base<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>,_std::allocator<std::unique_ptr<wasm::Memory,_std::default_delete<wasm::Memory>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_t).
           super___uniq_ptr_impl<wasm::Memory,_std::default_delete<wasm::Memory>_>._M_t;
      if (*(ulong *)((long)_Var8._M_t.
                           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                           .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x38) <
          *(ulong *)((long)_Var8._M_t.
                           super__Tuple_impl<0UL,_wasm::Memory_*,_std::default_delete<wasm::Memory>_>
                           .super__Head_base<0UL,_wasm::Memory_*,_false>._M_head_impl + 0x40)) {
        puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        RStack_68.inst = (Value *)*puVar24;
        aVar50 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(6,"memory",0);
        pvVar44 = (void *)0x18;
        RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar25.inst)->type = Null;
        cashew::Value::free(RVar25.inst,pvVar44);
        (RVar25.inst)->type = String;
        (RVar25.inst)->field_1 = aVar50;
        aVar50 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(4,"grow",0);
        pvVar44 = (void *)0x18;
        RVar26.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        (RVar26.inst)->type = Null;
        cashew::Value::free(RVar26.inst,pvVar44);
        (RVar26.inst)->type = String;
        (RVar26.inst)->field_1 = aVar50;
        RVar26 = cashew::ValueBuilder::makeDot(RVar25,RVar26);
        pcVar34 = _getGCData;
        sVar17 = WASM_MEMORY_GROW;
        sVar16 = BLOCK;
        RVar25.inst = cashew::SET.inst;
        pvVar44 = (void *)0x18;
        pVVar28 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
        pVVar28->type = Null;
        cashew::Value::free(pVVar28,pvVar44);
        pVVar28->type = String;
        (pVVar28->field_1).str.str._M_len = sVar17;
        (pVVar28->field_1).str.str._M_str = pcVar34;
        op.str._M_str = (char *)pVVar28;
        op.str._M_len = sVar16;
        RVar25 = cashew::ValueBuilder::makeBinary(RVar26.inst,RVar25,op,in_R8);
        cashew::Value::push_back(RStack_68.inst,RVar25);
      }
    }
  }
  puVar9 = (wasm->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar47 = (wasm->tables).
                 super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar47 != puVar9; puVar47 = puVar47 + 1
      ) {
    imp = (puVar47->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>._M_t
          .super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
          super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
    if (*(char **)((long)&(imp->super_Importable).module + 8) != (char *)0x0) {
      puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      ensureModuleVar(this,(Value *)*puVar24,&imp->super_Importable);
      RVar25 = cashew::ValueBuilder::makeVar(false);
      puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      cashew::Value::push_back((Value *)*puVar24,RVar25);
      sVar16 = _isalnum;
      RStack_68.inst = FUNCTION_TABLE;
      RVar26 = getImportName(this,&imp->super_Importable);
      name_02.str._M_str = (char *)RVar26.inst;
      name_02.str._M_len = sVar16;
      cashew::ValueBuilder::appendToVar((ValueBuilder *)RVar25.inst,RStack_68,name_02,in_R8);
    }
  }
  pWVar36 = (Wasm2JSBuilder *)&stack0xffffffffffffffc8;
  puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)pWVar36);
  addBasics(pWVar36,(Value *)*puVar24,wasm);
  puVar40 = (wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar40 != puVar6) {
    do {
      pFVar31 = (puVar40->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar31->super_Importable).module + 8) != (char *)0x0) {
        puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        addFunctionImport(this,(Value *)*puVar24,pFVar31);
      }
      puVar40 = puVar40 + 1;
    } while (puVar40 != puVar6);
  }
  puVar41 = (wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar41 != puVar10) {
    do {
      pGVar11 = (puVar41->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar11->super_Importable).module + 8) != (char *)0x0) {
        puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        addGlobalImport(this,(Value *)*puVar24,pGVar11);
      }
      puVar41 = puVar41 + 1;
    } while (puVar41 != puVar10);
  }
  puVar6 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar40 = (wasm->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar40 != puVar6; puVar40 = puVar40 + 1
      ) {
    fromName(this,(IString)*(IString *)
                            &(((puVar40->_M_t).
                               super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                               .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl)->
                             super_Importable).super_Named,Top);
  }
  puVar41 = (wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar10 = (wasm->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  RStack_68.inst._4_4_ = (uint)((ulong)RStack_68.inst >> 0x20);
  if (puVar41 == puVar10) {
    RStack_68.inst = (Value *)((ulong)RStack_68.inst._4_4_ << 0x20);
  }
  else {
    RStack_68.inst = (Value *)((ulong)RStack_68.inst._4_4_ << 0x20);
    do {
      pGVar11 = (puVar41->_M_t).
                super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
                super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      if (*(char **)((long)&(pGVar11->super_Importable).module + 8) == (char *)0x0) {
        puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        addGlobal(this,(Value *)*puVar24,pGVar11,wasm);
        RVar25.inst = RStack_68.inst;
        if ((this->flags).allowAsserts == true) {
          bVar48 = (byte)RStack_68.inst;
          RStack_68.inst._1_3_ = (int3)((ulong)RStack_68.inst >> 8);
          RStack_68.inst._0_1_ =
               bVar48 | *(char **)((long)&(pGVar11->super_Importable).super_Named + 8) == _fprintf;
          RStack_68.inst._4_4_ = SUB84(RVar25.inst,4);
        }
      }
      puVar41 = puVar41 + 1;
    } while (puVar41 != puVar10);
  }
  if ((this->flags).emscripten != false) {
    puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
    pVVar28 = (Value *)*puVar24;
    aVar50 = (anon_union_16_6_a0c44491_for_Value_2)
             ::wasm::IString::interned(0x1a,"// EMSCRIPTEN_START_FUNCS\n",0);
    pvVar44 = (void *)0x18;
    RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar25.inst)->type = Null;
    cashew::Value::free(RVar25.inst,pvVar44);
    (RVar25.inst)->type = String;
    (RVar25.inst)->field_1 = aVar50;
    cashew::Value::push_back(pVVar28,RVar25);
  }
  puVar40 = (wasm->functions).
            super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar6 = (wasm->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar40 != puVar6) {
    do {
      pFVar31 = (puVar40->_M_t).
                super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
                super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
      if (*(char **)((long)&(pFVar31->super_Importable).module + 8) == (char *)0x0) {
        puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
        pVVar28 = (Value *)*puVar24;
        RVar25 = processFunction(this,wasm,pFVar31,false);
        cashew::Value::push_back(pVVar28,RVar25);
      }
      puVar40 = puVar40 + 1;
    } while (puVar40 != puVar6);
  }
  if (((ulong)RStack_68.inst & 1) != 0) {
    puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
    type.id = EXPRESSION_RESULT.id;
    pVVar28 = (Value *)*puVar24;
    RStack_68.inst = WASM_FETCH_HIGH_BITS;
    ::wasm::HeapType::HeapType((HeapType *)&ret,(Signature)(ZEXT816(2) << 0x40));
    pcVar34 = _fprintf;
    uVar15 = INT64_TO_32_HIGH_BITS;
    auStack_998 = (undefined1  [8])0x0;
    _runner = (pointer)0x0;
    puVar29 = (undefined1 *)MixedArena::allocSpace(&wasm->allocator,0x20,8);
    *puVar29 = 10;
    *(undefined8 *)(puVar29 + 0x10) = uVar15;
    *(char **)(puVar29 + 0x18) = pcVar34;
    *(undefined8 *)(puVar29 + 8) = 2;
    puVar30 = (undefined1 *)MixedArena::allocSpace(&wasm->allocator,0x18,8);
    *puVar30 = 0x13;
    *(undefined8 *)(puVar30 + 8) = 1;
    *(undefined1 **)(puVar30 + 0x10) = puVar29;
    in_R8.inst = (Value *)auStack_998;
    name_04.super_IString.str._M_str = (char *)RStack_68.inst;
    name_04.super_IString.str._M_len = (size_t)&local_70;
    Builder::makeFunction
              (name_04,type,(vector<wasm::Type,_std::allocator<wasm::Type>_> *)ret.inst,
               (Expression *)in_R8.inst);
    pFVar31 = (Function *)::wasm::Module::addFunction((unique_ptr *)wasm);
    RVar25 = processFunction(this,wasm,pFVar31,false);
    cashew::Value::push_back(pVVar28,RVar25);
    if (local_70 != (Function *)0x0) {
      std::default_delete<wasm::Function>::operator()
                ((default_delete<wasm::Function> *)&local_70,local_70);
    }
    local_70 = (Function *)0x0;
    if (auStack_998 != (undefined1  [8])0x0) {
      operator_delete((void *)auStack_998,-(long)auStack_998);
    }
    psVar32 = (size_t *)operator_new(0x30);
    uVar14 = EXPRESSION_RESULT.id;
    pVVar28 = WASM_FETCH_HIGH_BITS;
    *psVar32 = (size_t)WASM_FETCH_HIGH_BITS;
    psVar32[1] = uVar14;
    *(undefined4 *)(psVar32 + 2) = 0;
    psVar32[3] = (size_t)pVVar28;
    psVar32[4] = uVar14;
    *(undefined1 *)(psVar32 + 5) = 0;
    ::wasm::Module::addExport((Export *)wasm);
  }
  if ((this->flags).emscripten == true) {
    puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
    pVVar28 = (Value *)*puVar24;
    aVar50 = (anon_union_16_6_a0c44491_for_Value_2)
             ::wasm::IString::interned(0x18,"// EMSCRIPTEN_END_FUNCS\n",0);
    pvVar44 = (void *)0x18;
    RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    (RVar25.inst)->type = Null;
    cashew::Value::free(RVar25.inst,pvVar44);
    (RVar25.inst)->type = String;
    (RVar25.inst)->field_1 = aVar50;
    cashew::Value::push_back(pVVar28,RVar25);
  }
  bVar18 = needsBufferView(wasm);
  if (bVar18) {
    puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
    pVVar28 = (Value *)*puVar24;
    aVar50 = (anon_union_16_6_a0c44491_for_Value_2)::wasm::IString::interned(10,"bufferView",0);
    pvVar44 = (void *)0x18;
    this_02 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    this_02->type = Null;
    cashew::Value::free(this_02,pvVar44);
    this_02->type = String;
    this_02->field_1 = aVar50;
    sVar16 = BLOCK;
    RVar25.inst = cashew::SET.inst;
    RStack_68.inst = cashew::HEAPU8;
    __end2._M_current = _getNumLocals;
    pvVar44 = (void *)0x18;
    this_03 = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
    this_03->type = Null;
    cashew::Value::free(this_03,pvVar44);
    this_03->type = String;
    (this_03->field_1).str.str._M_len = (size_t)RStack_68.inst;
    (this_03->field_1).str.str._M_str = (char *)__end2._M_current;
    op_00.str._M_str = (char *)this_03;
    op_00.str._M_len = sVar16;
    RVar25 = cashew::ValueBuilder::makeBinary((ValueBuilder *)this_02,RVar25,op_00,in_R8);
    cashew::Value::push_back(pVVar28,RVar25);
  }
  puVar21 = (wasm->dataSegments).
            super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  lVar35 = (long)(wasm->dataSegments).
                 super__Vector_base<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>,_std::allocator<std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar21;
  if (lVar35 != 0) {
    uVar37 = 1;
    uVar38 = 0;
    do {
      cVar19 = *(char *)((long)puVar21[uVar38]._M_t.
                               super___uniq_ptr_impl<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>
                               ._M_t + 0x28);
      if (cVar19 != '\x01') break;
      uVar38 = (ulong)uVar37;
      uVar37 = uVar37 + 1;
    } while (uVar38 < (ulong)(lVar35 >> 3));
    if (cVar19 == '\0') {
      puVar24 = (undefined8 *)cashew::Ref::operator[]((uint)&stack0xffffffffffffffc8);
      RStack_68.inst = (Value *)*puVar24;
      aVar50 = (anon_union_16_6_a0c44491_for_Value_2)
               ::wasm::IString::interned(0x12,"initActiveSegments",0);
      pvVar44 = (void *)0x18;
      RVar25.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar25.inst)->type = Null;
      cashew::Value::free(RVar25.inst,pvVar44);
      (RVar25.inst)->type = String;
      (RVar25.inst)->field_1 = aVar50;
      pcVar34 = _ZN4wasmL12importObjectE_1;
      pVVar28 = _ZN4wasmL12importObjectE_0.inst;
      pvVar44 = (void *)0x18;
      RVar26.inst = (Value *)MixedArena::allocSpace((MixedArena *)&cashew::arena,0x18,8);
      (RVar26.inst)->type = Null;
      cashew::Value::free(RVar26.inst,pvVar44);
      (RVar26.inst)->type = String;
      ((RVar26.inst)->field_1).str.str._M_len = (size_t)pVVar28;
      ((RVar26.inst)->field_1).str.str._M_str = pcVar34;
      RVar25 = cashew::ValueBuilder::makeCall(RVar25,RVar26);
      cashew::Value::push_back(RStack_68.inst,RVar25);
    }
  }
  uVar37 = (uint)&stack0xffffffffffffffc8;
  puVar24 = (undefined8 *)cashew::Ref::operator[](uVar37);
  addTable(this,(Value *)*puVar24,wasm);
  puVar24 = (undefined8 *)cashew::Ref::operator[](uVar37);
  addStart(this,(Value *)*puVar24,wasm);
  puVar24 = (undefined8 *)cashew::Ref::operator[](uVar37);
  addExports(this,(Value *)*puVar24,wasm);
  return (Ref)local_98;
}

Assistant:

Ref Wasm2JSBuilder::processWasm(Module* wasm, Name funcName) {
  // Scan the wasm for important things.
  for (auto& exp : wasm->exports) {
    if (exp->kind == ExternalKind::Function) {
      functionsCallableFromOutside.insert(*exp->getInternalName());
    }
  }
  ElementUtils::iterAllElementFunctionNames(
    wasm, [&](Name name) { functionsCallableFromOutside.insert(name); });

  // Collect passive data segment indices.
  for (Index i = 0; i < wasm->dataSegments.size(); ++i) {
    dataIndices[wasm->dataSegments[i]->name] = i;
  }

  // Ensure the scratch memory helpers.
  // If later on they aren't needed, we'll clean them up.
  ABI::wasm2js::ensureHelpers(wasm);

  // Process the code, and optimize if relevant.
  // First, do the lowering to a JS-friendly subset.
  {
    PassRunner runner(wasm, options);
    if (flags.emscripten) {
      runner.add("llvm-nontrapping-fptoint-lowering");
    }
    // TODO: only legalize if necessary - emscripten would already do so, and
    //       likely other toolchains. but spec test suite needs that.
    runner.add("legalize-js-interface");
    // Before lowering non-JS operations we can optimize some instructions which
    // may simplify next passes
    if (options.optimizeLevel > 0) {
      runner.add("optimize-for-js");
    }
    // First up remove as many non-JS operations we can, including things like
    // 64-bit integer multiplication/division, `f32.nearest` instructions, etc.
    // This may inject intrinsics which use i64 so it needs to be run before the
    // i64-to-i32 lowering pass.
    runner.add("remove-non-js-ops");
    // Currently the i64-to-32 lowering pass requires that `flatten` be run
    // before it to produce correct code. For some more details about this see
    // #1480
    runner.add("flatten");
    runner.add("i64-to-i32-lowering");
    runner.add("alignment-lowering");
    // Next, optimize that as best we can. This should not generate
    // non-JS-friendly things.
    if (options.optimizeLevel > 0) {
      // It is especially import to propagate constants after the lowering.
      // However, this can be a slow operation, especially after flattening;
      // some local simplification helps.
      if (options.optimizeLevel >= 3 || options.shrinkLevel >= 1) {
        runner.add("simplify-locals-nonesting");
        runner.add("precompute-propagate");
        // Avoiding reinterpretation is helped by propagation. We also run
        // it later down as default optimizations help as well.
        runner.add("avoid-reinterprets");
      }
      runner.addDefaultOptimizationPasses();
      runner.add("avoid-reinterprets");
    }
    // Finally, get the code into the flat form we need for wasm2js itself, and
    // optimize that a little in a way that keeps that property.
    runner.add("flatten");
    // Regardless of optimization level, run some simple optimizations to undo
    // some of the effects of flattening.
    runner.add("simplify-locals-notee-nostructure");
    // Some operations can be very slow if we didn't run full optimizations
    // earlier, so don't run them automatically.
    if (options.optimizeLevel > 0) {
      runner.add("remove-unused-names");
      runner.add("merge-blocks");
      runner.add("reorder-locals");
      runner.add("coalesce-locals");
    }
    runner.add("reorder-locals");
    runner.add("vacuum");
    runner.add("remove-unused-module-elements");
    // DCE at the end to make sure all IR nodes have valid types for conversion
    // to JS, and not unreachable.
    runner.add("dce");
    runner.setDebug(flags.debug);
    runner.run();
  }

  if (flags.symbolsFile.size() > 0) {
    Output out(flags.symbolsFile, wasm::Flags::Text);
    Index i = 0;
    for (auto& func : wasm->functions) {
      out.getStream() << i++ << ':' << func->name.str << '\n';
    }
  }

#ifndef NDEBUG
  if (!WasmValidator().validate(*wasm)) {
    std::cout << *wasm << '\n';
    Fatal() << "error in validating wasm2js output";
  }
#endif

  Ref ret = ValueBuilder::makeToplevel();
  Ref asmFunc = ValueBuilder::makeFunction(funcName);
  ret[1]->push_back(asmFunc);
  ValueBuilder::appendArgumentToFunction(asmFunc, importObject);

  // add memory import
  if (!wasm->memories.empty()) {
    if (wasm->memories[0]->imported()) {
      ensureModuleVar(asmFunc[3], *wasm->memories[0]);

      // find memory and buffer in imports
      Ref theVar = ValueBuilder::makeVar();
      asmFunc[3]->push_back(theVar);
      ValueBuilder::appendToVar(
        theVar, "memory", getImportName(*wasm->memories[0]));

      // Assign `buffer = memory.buffer`
      Ref buf = ValueBuilder::makeVar();
      asmFunc[3]->push_back(buf);
      ValueBuilder::appendToVar(
        buf,
        BUFFER,
        ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                              ValueBuilder::makeName("buffer")));

      // If memory is growable, override the imported memory's grow method to
      // ensure so that when grow is called from the output it works as expected
      if (wasm->memories[0]->max > wasm->memories[0]->initial) {
        asmFunc[3]->push_back(
          ValueBuilder::makeStatement(ValueBuilder::makeBinary(
            ValueBuilder::makeDot(ValueBuilder::makeName("memory"),
                                  ValueBuilder::makeName("grow")),
            SET,
            ValueBuilder::makeName(WASM_MEMORY_GROW))));
      }
    } else {
      Ref theVar = ValueBuilder::makeVar();
      asmFunc[3]->push_back(theVar);
      ValueBuilder::appendToVar(
        theVar,
        BUFFER,
        ValueBuilder::makeNew(ValueBuilder::makeCall(
          ValueBuilder::makeName("ArrayBuffer"),
          ValueBuilder::makeInt(Address::address32_t(
            wasm->memories[0]->initial.addr * Memory::kPageSize)))));
    }
  }

  // add imported tables
  ModuleUtils::iterImportedTables(*wasm, [&](Table* table) {
    ensureModuleVar(asmFunc[3], *table);
    Ref theVar = ValueBuilder::makeVar();
    asmFunc[3]->push_back(theVar);
    ValueBuilder::appendToVar(theVar, FUNCTION_TABLE, getImportName(*table));
  });

  // create heaps, etc
  addBasics(asmFunc[3], wasm);
  ModuleUtils::iterImportedFunctions(
    *wasm, [&](Function* import) { addFunctionImport(asmFunc[3], import); });
  ModuleUtils::iterImportedGlobals(
    *wasm, [&](Global* import) { addGlobalImport(asmFunc[3], import); });

  // Note the names of functions. We need to do this here as when generating
  // mangled local names we need them not to conflict with these (see fromName)
  // so we can't wait until we parse each function to note its name.
  for (auto& f : wasm->functions) {
    fromName(f->name, NameScope::Top);
  }

  // globals
  bool generateFetchHighBits = false;
  ModuleUtils::iterDefinedGlobals(*wasm, [&](Global* global) {
    addGlobal(asmFunc[3], global, wasm);
    if (flags.allowAsserts && global->name == INT64_TO_32_HIGH_BITS) {
      generateFetchHighBits = true;
    }
  });
  if (flags.emscripten) {
    asmFunc[3]->push_back(
      ValueBuilder::makeName("// EMSCRIPTEN_START_FUNCS\n"));
  }
  // functions
  ModuleUtils::iterDefinedFunctions(*wasm, [&](Function* func) {
    asmFunc[3]->push_back(processFunction(wasm, func));
  });
  if (generateFetchHighBits) {
    Builder builder(*wasm);
    asmFunc[3]->push_back(
      processFunction(wasm,
                      wasm->addFunction(builder.makeFunction(
                        WASM_FETCH_HIGH_BITS,
                        Signature(Type::none, Type::i32),
                        {},
                        builder.makeReturn(builder.makeGlobalGet(
                          INT64_TO_32_HIGH_BITS, Type::i32))))));
    wasm->addExport(new Export(
      WASM_FETCH_HIGH_BITS, ExternalKind::Function, WASM_FETCH_HIGH_BITS));
  }
  if (flags.emscripten) {
    asmFunc[3]->push_back(ValueBuilder::makeName("// EMSCRIPTEN_END_FUNCS\n"));
  }

  if (needsBufferView(*wasm)) {
    asmFunc[3]->push_back(
      ValueBuilder::makeBinary(ValueBuilder::makeName("bufferView"),
                               SET,
                               ValueBuilder::makeName(HEAPU8)));
  }
  if (hasActiveSegments(*wasm)) {
    asmFunc[3]->push_back(
      ValueBuilder::makeCall(ValueBuilder::makeName("initActiveSegments"),
                             ValueBuilder::makeName(importObject)));
  }

  addTable(asmFunc[3], wasm);
  addStart(asmFunc[3], wasm);
  addExports(asmFunc[3], wasm);
  return ret;
}